

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxGetDefaultByType::Resolve(FxGetDefaultByType *this,FCompileContext *ctx)

{
  PType *p;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  PClassPointer *pPVar4;
  PClassActor *restrict;
  FxConstant *this_00;
  PPointer *pPVar5;
  ExpVal *this_01;
  undefined1 local_38 [28];
  FName local_1c;
  FxExpression *pFVar3;
  
  if (this->Self != (FxExpression *)0x0) {
    iVar2 = (*this->Self->_vptr_FxExpression[2])();
    pFVar3 = (FxExpression *)CONCAT44(extraout_var,iVar2);
    this->Self = pFVar3;
    if (pFVar3 != (FxExpression *)0x0) {
      p = pFVar3->ValueType;
      if ((p == (PType *)TypeString) || (p == (PType *)TypeName)) {
        iVar2 = (*pFVar3->_vptr_FxExpression[3])(pFVar3);
        if ((char)iVar2 == '\0') {
          ExpVal::ExpVal((ExpVal *)(local_38 + 8),(ExpVal *)(this->Self + 1));
          ExpVal::GetString((ExpVal *)local_38);
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "GetDefaultByType() requires an actor class type, but got %s",local_38._0_8_);
        }
        else {
          this_01 = (ExpVal *)(local_38 + 8);
          ExpVal::ExpVal(this_01,(ExpVal *)(this->Self + 1));
          ExpVal::GetName((ExpVal *)&local_1c);
          restrict = PClass::FindActor(&local_1c);
          ExpVal::~ExpVal((ExpVal *)(local_38 + 8));
          if (restrict != (PClassActor *)0x0) {
            this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)this_01)
            ;
            pPVar4 = NewClassPointer(&restrict->super_PClass);
            FxConstant::FxConstant
                      (this_00,&restrict->super_PClass,pPVar4,
                       &(this->super_FxExpression).ScriptPosition);
            this->Self = (FxExpression *)this_00;
            goto LAB_00517c16;
          }
          ExpVal::ExpVal((ExpVal *)(local_38 + 8),(ExpVal *)(this->Self + 1));
          ExpVal::GetString((ExpVal *)local_38);
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "GetDefaultByType() requires an actor class type, but got %s",local_38._0_8_);
        }
        FString::~FString((FString *)local_38);
        ExpVal::~ExpVal((ExpVal *)(local_38 + 8));
      }
      else {
        pPVar4 = dyn_cast<PClassPointer>((DObject *)p);
        if ((pPVar4 != (PClassPointer *)0x0) &&
           (bVar1 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,pPVar4->ClassRestriction),
           bVar1)) {
          restrict = (PClassActor *)pPVar4->ClassRestriction;
LAB_00517c16:
          pPVar5 = NewPointer((PType *)restrict,true);
          (this->super_FxExpression).ValueType = (PType *)pPVar5;
          return &this->super_FxExpression;
        }
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "GetDefaultByType() requires an actor class type");
      }
    }
  }
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxGetDefaultByType::Resolve(FCompileContext &ctx)
{
	SAFE_RESOLVE(Self, ctx);
	PClass *cls = nullptr;

	if (Self->ValueType == TypeString || Self->ValueType == TypeName)
	{
		if (Self->isConstant())
		{
			cls = PClass::FindActor(static_cast<FxConstant *>(Self)->GetValue().GetName());
			if (cls == nullptr)
			{
				ScriptPosition.Message(MSG_ERROR, "GetDefaultByType() requires an actor class type, but got %s", static_cast<FxConstant *>(Self)->GetValue().GetString().GetChars());
				delete this;
				return nullptr;
			}
			Self = new FxConstant(cls, NewClassPointer(cls), ScriptPosition);
		}
		else
		{
			// this is the ugly case. We do not know what we have and cannot do proper type casting.
			// For now error out and let this case require explicit handling on the user side.
			ScriptPosition.Message(MSG_ERROR, "GetDefaultByType() requires an actor class type, but got %s", static_cast<FxConstant *>(Self)->GetValue().GetString().GetChars());
			delete this;
			return nullptr;
		}
	}
	else
	{
		auto cp = dyn_cast<PClassPointer>(Self->ValueType);
		if (cp == nullptr || !cp->ClassRestriction->IsDescendantOf(RUNTIME_CLASS(AActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "GetDefaultByType() requires an actor class type");
			delete this;
			return nullptr;
		}
		cls = cp->ClassRestriction;
	}
	ValueType = NewPointer(cls, true);
	return this;
}